

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::Write(DBImpl *this,WriteOptions *options,WriteBatch *updates)

{
  pthread_mutex_t *__mutex;
  _func_int **pp_Var1;
  Writer *this_00;
  int iVar2;
  MemTable *memtable;
  long in_RCX;
  long lVar3;
  Writer *pWVar4;
  bool bVar5;
  Writer *last_writer;
  Writer w;
  Writer *local_b0;
  long local_a8;
  long local_a0;
  undefined1 local_98 [24];
  Writer local_80;
  
  __mutex = (pthread_mutex_t *)(options + 0x8c8);
  Writer::Writer(&local_80,(Mutex *)&__mutex->__data);
  local_80.sync = *(bool *)&(updates->rep_)._M_dataplus._M_p;
  local_80.done = false;
  std::mutex::lock((mutex *)&__mutex->__data);
  local_98._0_8_ = &local_80;
  std::deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>>::
  emplace_back<leveldb::DBImpl::Writer*>
            ((deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>> *)
             (options + 0x968),(Writer **)local_98);
  while( true ) {
    if (local_80.done != false) goto LAB_0010bc72;
    if (&local_80 == (Writer *)**(undefined8 **)(options + 0x978)) break;
    port::CondVar::Wait(&local_80.cv);
  }
  MakeRoomForWrite(this,SUB81(options,0));
  lVar3 = *(long *)(*(long *)(options + 0xa20) + 0x58);
  pWVar4 = &local_80;
  local_b0 = &local_80;
  if ((in_RCX != 0) && ((this->super_DB)._vptr_DB == (_func_int **)0x0)) {
    memtable = (MemTable *)BuildBatchGroup((DBImpl *)options,&local_b0);
    local_a0 = lVar3;
    WriteBatchInternal::SetSequence((WriteBatch *)memtable,lVar3 + 1);
    iVar2 = WriteBatchInternal::Count((WriteBatch *)memtable);
    local_a8 = (long)iVar2;
    pthread_mutex_unlock(__mutex);
    local_98._0_8_ = (memtable->comparator_).comparator.super_Comparator._vptr_Comparator;
    local_98._8_8_ = (memtable->comparator_).comparator.user_comparator_;
    log::Writer::AddRecord((Writer *)(local_98 + 0x10),*(Slice **)(options + 0x958));
    pp_Var1 = (this->super_DB)._vptr_DB;
    (this->super_DB)._vptr_DB = (_func_int **)local_98._16_8_;
    local_98._16_8_ = pp_Var1;
    Status::~Status((Status *)(local_98 + 0x10));
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      if (*(char *)&(updates->rep_)._M_dataplus._M_p == '\x01') {
        (**(code **)(**(long **)(options + 0x948) + 0x28))((Status *)local_98);
        pWVar4 = (Writer *)(this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_98._0_8_;
        local_98._0_8_ = pWVar4;
        Status::~Status((Status *)local_98);
        bVar5 = (this->super_DB)._vptr_DB != (_func_int **)0x0;
        if (!bVar5) goto LAB_0010bd9a;
      }
      else {
        bVar5 = false;
LAB_0010bd9a:
        WriteBatchInternal::InsertInto((WriteBatch *)local_98,memtable);
        pWVar4 = (Writer *)(this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_98._0_8_;
        local_98._0_8_ = pWVar4;
        Status::~Status((Status *)local_98);
      }
      std::mutex::lock((mutex *)&__mutex->__data);
      if (bVar5) {
        RecordBackgroundError((DBImpl *)options,(Status *)this);
      }
    }
    else {
      std::mutex::lock((mutex *)&__mutex->__data);
    }
    lVar3 = local_a0 + local_a8;
    if (memtable == *(MemTable **)(options + 0x9b8)) {
      WriteBatch::Clear((WriteBatch *)*(MemTable **)(options + 0x9b8));
    }
    *(long *)(*(long *)(options + 0xa20) + 0x58) = lVar3;
    pWVar4 = local_b0;
  }
  do {
    this_00 = (Writer *)**(undefined8 **)(options + 0x978);
    std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::pop_front
              ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
               (options + 0x968));
    if (this_00 != &local_80) {
      Status::operator=((Status *)this_00,(Status *)this);
      this_00->done = true;
      std::condition_variable::notify_one();
    }
  } while (this_00 != pWVar4);
  if (*(long *)(options + 0x998) != *(long *)(options + 0x978)) {
    std::condition_variable::notify_one();
  }
LAB_0010be69:
  pthread_mutex_unlock(__mutex);
  Writer::~Writer(&local_80);
  return (Status)(char *)this;
LAB_0010bc72:
  Status::Status((Status *)this,&local_80.status);
  goto LAB_0010be69;
}

Assistant:

Status DBImpl::Write(const WriteOptions& options, WriteBatch* updates) {
  Writer w(&mutex_);
  w.batch = updates;
  w.sync = options.sync;
  w.done = false;

  MutexLock l(&mutex_);
  writers_.push_back(&w);
  while (!w.done && &w != writers_.front()) {
    w.cv.Wait();
  }
  if (w.done) {
    return w.status;
  }

  // May temporarily unlock and wait.
  Status status = MakeRoomForWrite(updates == nullptr);
  uint64_t last_sequence = versions_->LastSequence();
  Writer* last_writer = &w;
  if (status.ok() && updates != nullptr) {  // nullptr batch is for compactions
    WriteBatch* write_batch = BuildBatchGroup(&last_writer);
    WriteBatchInternal::SetSequence(write_batch, last_sequence + 1);
    last_sequence += WriteBatchInternal::Count(write_batch);

    // Add to log and apply to memtable.  We can release the lock
    // during this phase since &w is currently responsible for logging
    // and protects against concurrent loggers and concurrent writes
    // into mem_.
    {
      mutex_.Unlock();
      status = log_->AddRecord(WriteBatchInternal::Contents(write_batch));
      bool sync_error = false;
      if (status.ok() && options.sync) {
        status = logfile_->Sync();
        if (!status.ok()) {
          sync_error = true;
        }
      }
      if (status.ok()) {
        status = WriteBatchInternal::InsertInto(write_batch, mem_);
      }
      mutex_.Lock();
      if (sync_error) {
        // The state of the log file is indeterminate: the log record we
        // just added may or may not show up when the DB is re-opened.
        // So we force the DB into a mode where all future writes fail.
        RecordBackgroundError(status);
      }
    }
    if (write_batch == tmp_batch_) tmp_batch_->Clear();

    versions_->SetLastSequence(last_sequence);
  }

  while (true) {
    Writer* ready = writers_.front();
    writers_.pop_front();
    if (ready != &w) {
      ready->status = status;
      ready->done = true;
      ready->cv.Signal();
    }
    if (ready == last_writer) break;
  }

  // Notify new head of write queue
  if (!writers_.empty()) {
    writers_.front()->cv.Signal();
  }

  return status;
}